

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::UBOBindingRenderCase::generateShaders
          (UBOBindingRenderCase *this)

{
  ShaderType SVar1;
  RenderContext *renderCtx;
  ostream *poVar2;
  ShaderProgram *this_00;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  int declNdx;
  ulong uVar7;
  string uname;
  ostringstream shaderBody;
  ostringstream shaderUniformDecl;
  undefined1 local_638 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  uint local_60c;
  uint local_608;
  undefined4 uStack_604;
  value_type local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string *local_560;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  undefined1 local_498 [112];
  ios_base local_428 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_408;
  undefined1 local_3e8 [200];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  uVar6 = (this->super_LayoutBindingRenderCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar4 = 1;
  if (1 < uVar6) {
    uVar4 = (this->super_LayoutBindingRenderCase).m_numBindings;
  }
  if (0 < (int)uVar4) {
    local_560 = &(this->super_LayoutBindingRenderCase).m_uniformName;
    uVar7 = 0;
    local_60c = uVar6;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(std140, binding = ",0x19);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)local_1a8,
                          (this->super_LayoutBindingRenderCase).m_bindings.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") uniform ",10);
      declNdx = (int)uVar7;
      getUniformName((string *)local_498,local_560,declNdx);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color1;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\thighp vec4 color2;\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} ",2);
      if (uVar6 < 2) {
        local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"colors","");
        getUniformName((string *)local_638,&local_580,declNdx,
                       (this->super_LayoutBindingRenderCase).m_numBindings);
        uVar6 = local_60c;
      }
      else {
        local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"colors","");
        getUniformName((string *)local_638,&local_5a0,declNdx);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_638._4_4_,local_638._0_4_),local_638._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_638._4_4_,local_638._0_4_) != &local_628) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_638._4_4_,local_638._0_4_),
                        local_628._M_allocated_capacity + 1);
      }
      if (uVar6 < 2) {
LAB_01483964:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_580._M_dataplus._M_p != &local_580.field_2) {
          operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
          operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
        }
        if (uVar6 < 2) goto LAB_01483964;
      }
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  if (0 < (this->super_LayoutBindingRenderCase).m_numBindings * 2) {
    uVar4 = 0;
    do {
      if (uVar6 < 2) {
        local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"colors","");
        getUniformName((string *)local_638,&local_5e0,0,uVar4 >> 1);
LAB_01483a95:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"colors","");
        getUniformName((string *)local_638,&local_5c0,uVar4 >> 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
        }
        if (uVar6 < 2) goto LAB_01483a95;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t",1);
      pcVar5 = "else if";
      if (uVar4 == 0) {
        pcVar5 = "if";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,pcVar5,(ulong)(uVar4 != 0) * 5 + 2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320," (u_arrayNdx == ",0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::operator<<((ostringstream *)local_498,uVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,(char *)CONCAT44(uStack_604,local_608),
                          (long)local_600._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t{\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t\tcolor = ",10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT44(local_638._4_4_,local_638._0_4_),local_638._8_8_);
      pcVar5 = ".color2";
      if ((uVar4 & 1) == 0) {
        pcVar5 = ".color1";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t}\n",3);
      if ((size_type *)CONCAT44(uStack_604,local_608) != &local_600._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(uStack_604,local_608),local_600._M_string_length + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_638._4_4_,local_638._0_4_) != &local_628) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_638._4_4_,local_638._0_4_),
                        local_628._M_allocated_capacity + 1);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < (this->super_LayoutBindingRenderCase).m_numBindings * 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\telse\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t{\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\t}\n",3);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_LayoutBindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  local_3e8[0x10] = 0;
  local_3e8._17_8_ = 0;
  local_3e8._0_8_ = (pointer)0x0;
  local_3e8[8] = 0;
  local_3e8._9_7_ = 0;
  memset(local_498,0,0xac);
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_538,SVar1,&local_4b8,&local_4d8);
  local_638._0_4_ = 0;
  local_638._8_8_ = local_628._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_638 + 8),local_538._M_dataplus._M_p,
             local_538._M_dataplus._M_p + local_538._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (ulong)(uint)local_638._0_4_ * 0x18),(value_type *)(local_638 + 8));
  SVar1 = (this->super_LayoutBindingRenderCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_558,SVar1,&local_4f8,&local_518);
  local_608 = 1;
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_600,local_558._M_dataplus._M_p,
             local_558._M_dataplus._M_p + local_558._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + (ulong)local_608 * 0x18),&local_600);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_638._8_8_ != local_628._M_local_buf + 8) {
    operator_delete((void *)local_638._8_8_,local_628._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3e8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_408);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_498 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return this_00;
}

Assistant:

glu::ShaderProgram* UBOBindingRenderCase::generateShaders (void) const
{
	std::ostringstream		shaderUniformDecl;
	std::ostringstream		shaderBody;
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		shaderUniformDecl << "layout(std140, binding = " << m_bindings[declNdx] << ") uniform "
			<< getUniformName(m_uniformName, declNdx) << "\n"
			<< "{\n"
			<< "	highp vec4 color1;\n"
			<< "	highp vec4 color2;\n"
			<< "} " << (arrayInstance ? getUniformName("colors", declNdx, m_numBindings) : getUniformName("colors", declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings*2; ++bindNdx)	// Multiply by two to cover cases for both colors for each UBO
	{
		const std::string uname = (arrayInstance ? getUniformName("colors", 0, bindNdx/2) : getUniformName("colors", bindNdx/2));
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = " << uname << (bindNdx%2 == 0 ? ".color1" : ".color2") << ";\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
					<< glu::VertexSource(generateVertexShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str()))
					<< glu::FragmentSource(generateFragmentShader(m_shaderType, shaderUniformDecl.str(), shaderBody.str())));
}